

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O1

void do_medit(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  DESCRIPTOR_DATA *pDVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  MOB_INDEX_DATA *pMVar6;
  AREA_DATA_conflict *pAVar7;
  char *pcVar8;
  char arg1 [4608];
  char local_1228 [4608];
  
  bVar3 = check_security(ch);
  if (!bVar3) {
    return;
  }
  pcVar5 = one_argument(argument,local_1228);
  bVar3 = is_number(local_1228);
  if (bVar3) {
    atoi(local_1228);
    pMVar6 = get_mob_index(0);
    if (pMVar6 == (MOB_INDEX_DATA *)0x0) {
      pcVar5 = "MEdit:  That vnum does not exist.\n\r";
      goto LAB_0035b8b8;
    }
    bVar3 = is_switched(ch);
    if (!bVar3) {
      iVar4 = ch->pcdata->security;
      pAVar7 = pMVar6->area;
      iVar1 = pAVar7->security;
      if (((iVar1 < iVar4) || (pcVar5 = strstr(pAVar7->builders,ch->name), iVar1 < iVar4)) ||
         ((pcVar5 != (char *)0x0 || (pcVar5 = strstr(pAVar7->builders,"All"), pcVar5 != (char *)0x0)
          ))) {
        pDVar2 = ch->desc;
        pDVar2->pEdit = pMVar6;
        pDVar2->editor = 4;
        medit_show(ch,"");
        return;
      }
    }
  }
  else {
    bVar3 = str_cmp(local_1228,"create");
    if (bVar3) {
      pcVar5 = "MEdit:  There is no default mobile to edit.\n\r";
      goto LAB_0035b8b8;
    }
    iVar4 = atoi(pcVar5);
    if (iVar4 == 0 || local_1228[0] == '\0') {
      pcVar5 = "Syntax:  edit mobile create [vnum]\n\r";
      goto LAB_0035b8b8;
    }
    pAVar7 = get_vnum_area(iVar4);
    if (pAVar7 == (AREA_DATA_conflict *)0x0) {
      pcVar5 = "MEdit:  That vnum is not assigned an area.\n\r";
      goto LAB_0035b8b8;
    }
    bVar3 = is_switched(ch);
    if (!bVar3) {
      iVar4 = ch->pcdata->security;
      iVar1 = pAVar7->security;
      if ((((iVar1 < iVar4) || (pcVar8 = strstr(pAVar7->builders,ch->name), iVar1 < iVar4)) ||
          (pcVar8 != (char *)0x0)) ||
         (pcVar8 = strstr(pAVar7->builders,"All"), pcVar8 != (char *)0x0)) {
        bVar3 = medit_create(ch,pcVar5);
        if (!bVar3) {
          return;
        }
        *(byte *)pAVar7->area_flags = (byte)pAVar7->area_flags[0] | 8;
        ch->desc->editor = 4;
        return;
      }
    }
  }
  pcVar5 = "Insufficient security to modify mobs.\n\r";
LAB_0035b8b8:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_medit(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	AREA_DATA *pArea;
	int value;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (is_number(arg1))
	{
		value = atoi(arg1);
		if (!(pMob = get_mob_index(value)))
		{
			send_to_char("MEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pMob->area))
		{
			send_to_char("Insufficient security to modify mobs.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pMob;
		ch->desc->editor = ED_MOBILE;

		medit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (arg1[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit mobile create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("MEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify mobs.\n\r", ch);
				return;
			}

			if (medit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_MOBILE;
			}

			return;
		}
	}

	send_to_char("MEdit:  There is no default mobile to edit.\n\r", ch);
}